

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sqlite3.c
# Opt level: O3

int vdbeMergeEngineStep(MergeEngine *pMerger,int *pbEof)

{
  SortSubtask *pTask;
  bool bVar1;
  uint uVar2;
  int iVar3;
  PmaReader *pPVar4;
  ulong uVar5;
  int *piVar6;
  PmaReader *pPVar7;
  uint uVar8;
  u8 *pKey2;
  PmaReader *pPVar9;
  
  pTask = pMerger->pTask;
  uVar8 = pMerger->aTree[1];
  uVar2 = vdbePmaReaderNext(pMerger->aReadr + (int)uVar8);
  if (uVar2 == 0) {
    pPVar4 = pMerger->aReadr;
    uVar2 = pMerger->nTree + uVar8;
    if ((int)uVar2 < 2) {
      piVar6 = pMerger->aTree;
    }
    else {
      uVar5 = (long)(int)uVar8 | 1;
      pPVar7 = pPVar4 + uVar5;
      pKey2 = pPVar4[uVar5].aKey;
      pPVar9 = (PmaReader *)((long)&pPVar4->iReadOff + (ulong)((uVar8 & 0xfffe) * 0x50));
      do {
        uVar8 = uVar2 >> 1;
        if (pPVar9->pFd == (sqlite3_file *)0x0) {
LAB_0013a57d:
          piVar6 = pMerger->aTree;
          piVar6[uVar8] = (int)((ulong)((long)pPVar7 - (long)pPVar4) >> 4) * -0x33333333;
          pPVar9 = pPVar4 + piVar6[uVar8 ^ 1];
        }
        else {
          if (pPVar7->pFd != (sqlite3_file *)0x0) {
            iVar3 = vdbeSorterCompare(pTask,pPVar9->aKey,pPVar9->nKey,pKey2,pPVar7->nKey);
            if (iVar3 < 0) {
              pPVar4 = pMerger->aReadr;
            }
            else {
              pPVar4 = pMerger->aReadr;
              if ((iVar3 != 0) || (pPVar7 <= pPVar9)) {
                if (pPVar9->pFd != (sqlite3_file *)0x0) {
                  pKey2 = (u8 *)0x0;
                }
                goto LAB_0013a57d;
              }
            }
          }
          piVar6 = pMerger->aTree;
          piVar6[uVar8] = (int)((ulong)((long)pPVar9 - (long)pPVar4) >> 4) * -0x33333333;
          pPVar7 = pPVar4 + piVar6[uVar8 ^ 1];
          pKey2 = pPVar4[piVar6[uVar8 ^ 1]].aKey;
        }
        bVar1 = 3 < uVar2;
        uVar2 = uVar8;
      } while (bVar1);
    }
    *pbEof = (uint)(pPVar4[piVar6[1]].pFd == (sqlite3_file *)0x0);
    uVar2 = (uint)pTask->pUnpacked->errCode;
  }
  return uVar2;
}

Assistant:

static int vdbeMergeEngineStep(
  MergeEngine *pMerger,      /* The merge engine to advance to the next row */
  int *pbEof                 /* Set TRUE at EOF.  Set false for more content */
){
  int rc;
  int iPrev = pMerger->aTree[1];/* Index of PmaReader to advance */
  SortSubtask *pTask = pMerger->pTask;

  /* Advance the current PmaReader */
  rc = vdbePmaReaderNext(&pMerger->aReadr[iPrev]);

  /* Update contents of aTree[] */
  if( rc==SQLITE_OK ){
    int i;                      /* Index of aTree[] to recalculate */
    PmaReader *pReadr1;         /* First PmaReader to compare */
    PmaReader *pReadr2;         /* Second PmaReader to compare */
    u8 *pKey2;                  /* To pReadr2->aKey, or 0 if record cached */

    /* Find the first two PmaReaders to compare. The one that was just
    ** advanced (iPrev) and the one next to it in the array.  */
    pReadr1 = &pMerger->aReadr[(iPrev & 0xFFFE)];
    pReadr2 = &pMerger->aReadr[(iPrev | 0x0001)];
    pKey2 = pReadr2->aKey;

    for(i=(pMerger->nTree+iPrev)/2; i>0; i=i/2){
      /* Compare pReadr1 and pReadr2. Store the result in variable iRes. */
      int iRes;
      if( pReadr1->pFd==0 ){
        iRes = +1;
      }else if( pReadr2->pFd==0 ){
        iRes = -1;
      }else{
        iRes = vdbeSorterCompare(pTask, 
            pReadr1->aKey, pReadr1->nKey, pKey2, pReadr2->nKey
        );
      }

      /* If pReadr1 contained the smaller value, set aTree[i] to its index.
      ** Then set pReadr2 to the next PmaReader to compare to pReadr1. In this
      ** case there is no cache of pReadr2 in pTask->pUnpacked, so set
      ** pKey2 to point to the record belonging to pReadr2.
      **
      ** Alternatively, if pReadr2 contains the smaller of the two values,
      ** set aTree[i] to its index and update pReadr1. If vdbeSorterCompare()
      ** was actually called above, then pTask->pUnpacked now contains
      ** a value equivalent to pReadr2. So set pKey2 to NULL to prevent
      ** vdbeSorterCompare() from decoding pReadr2 again.
      **
      ** If the two values were equal, then the value from the oldest
      ** PMA should be considered smaller. The VdbeSorter.aReadr[] array
      ** is sorted from oldest to newest, so pReadr1 contains older values
      ** than pReadr2 iff (pReadr1<pReadr2).  */
      if( iRes<0 || (iRes==0 && pReadr1<pReadr2) ){
        pMerger->aTree[i] = (int)(pReadr1 - pMerger->aReadr);
        pReadr2 = &pMerger->aReadr[ pMerger->aTree[i ^ 0x0001] ];
        pKey2 = pReadr2->aKey;
      }else{
        if( pReadr1->pFd ) pKey2 = 0;
        pMerger->aTree[i] = (int)(pReadr2 - pMerger->aReadr);
        pReadr1 = &pMerger->aReadr[ pMerger->aTree[i ^ 0x0001] ];
      }
    }
    *pbEof = (pMerger->aReadr[pMerger->aTree[1]].pFd==0);
  }

  return (rc==SQLITE_OK ? pTask->pUnpacked->errCode : rc);
}